

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

iterator __thiscall
wabt::intrusive_list<wabt::Expr>::insert
          (intrusive_list<wabt::Expr> *this,iterator pos,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  Expr *pEVar1;
  bool bVar2;
  reference pvVar3;
  pointer pEVar4;
  reference pEVar5;
  intrusive_list<wabt::Expr> *piVar6;
  iterator rhs;
  iterator iVar7;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  undefined1 local_30 [8];
  iterator pos_local;
  
  pos_local.list_ = (intrusive_list<wabt::Expr> *)pos.node_;
  local_30 = (undefined1  [8])pos.list_;
  pEVar1 = (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  if (((pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ == (Expr *)0x0) &&
     ((pEVar1->super_intrusive_list_base<wabt::Expr>).next_ == (Expr *)0x0)) {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = this;
    bVar2 = iterator::operator==((iterator *)local_30,rhs);
    if (bVar2) {
      local_38._M_head_impl =
           (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      push_back(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
      if (local_38._M_head_impl != (Expr *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Expr[1])();
      }
      local_38._M_head_impl = (Expr *)0x0;
      pvVar3 = back(this);
    }
    else {
      pvVar3 = (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
               .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      pEVar4 = iterator::operator->((iterator *)local_30);
      (pvVar3->super_intrusive_list_base<wabt::Expr>).prev_ =
           (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_;
      pEVar5 = iterator::operator*((iterator *)local_30);
      (pvVar3->super_intrusive_list_base<wabt::Expr>).next_ = pEVar5;
      pEVar4 = iterator::operator->((iterator *)local_30);
      piVar6 = this;
      if ((pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) {
        pEVar4 = iterator::operator->((iterator *)local_30);
        piVar6 = (intrusive_list<wabt::Expr> *)
                 &((pEVar4->super_intrusive_list_base<wabt::Expr>).prev_)->
                  super_intrusive_list_base<wabt::Expr>;
      }
      piVar6->first_ = pvVar3;
      pEVar4 = iterator::operator->((iterator *)local_30);
      (pEVar4->super_intrusive_list_base<wabt::Expr>).prev_ = pvVar3;
      this->size_ = this->size_ + 1;
    }
    iVar7.node_ = pvVar3;
    iVar7.list_ = this;
    return iVar7;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                ,0x205,
                "typename intrusive_list<T>::iterator wabt::intrusive_list<wabt::Expr>::insert(iterator, std::unique_ptr<T>) [T = wabt::Expr]"
               );
}

Assistant:

inline typename intrusive_list<T>::iterator intrusive_list<T>::insert(
    iterator pos,
    std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p;
  if (pos == end()) {
    push_back(std::move(node));
    node_p = &back();
  } else {
    node_p = node.release();
    node_p->prev_ = pos->prev_;
    node_p->next_ = &*pos;
    if (pos->prev_) {
      pos->prev_->next_ = node_p;
    } else {
      first_ = node_p;
    }
    pos->prev_ = node_p;
    size_++;
  }
  return iterator(*this, node_p);
}